

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.cpp
# Opt level: O1

uint32_t __thiscall
ixy::IxgbeDevice::tx_batch
          (IxgbeDevice *this,uint16_t queue_id,
          deque<ixy::Packet,_std::allocator<ixy::Packet>_> *buffer)

{
  uint16_t uVar1;
  undefined2 uVar2;
  pointer piVar3;
  _Elt_pointer pPVar4;
  ixgbe_adv_tx_desc *piVar5;
  uint64_t *puVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint32_t uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  value_type *p;
  undefined6 in_register_00000032;
  ulong uVar11;
  ixgbe_tx_queue *queue;
  uint16_t uVar12;
  uint uVar13;
  
  uVar11 = CONCAT62(in_register_00000032,queue_id) & 0xffffffff;
  piVar3 = (this->tx_queues).
           super__Vector_base<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar9 = ((long)(this->tx_queues).
                 super__Vector_base<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)piVar3 >> 4) * 0x6db6db6db6db6db7
  ;
  if (uVar9 < uVar11 || uVar9 - uVar11 == 0) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  }
  else {
    queue = piVar3 + uVar11;
    clean_tx_queue(queue);
    uVar1 = piVar3[uVar11].clean_index;
    uVar10 = (uint)piVar3[uVar11].tx_index;
    if ((piVar3[uVar11].mempool.super___shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         == (element_type *)0x0) &&
       (pPVar4 = (buffer->super__Deque_base<ixy::Packet,_std::allocator<ixy::Packet>_>)._M_impl.
                 super__Deque_impl_data._M_start._M_cur,
       (buffer->super__Deque_base<ixy::Packet,_std::allocator<ixy::Packet>_>)._M_impl.
       super__Deque_impl_data._M_finish._M_cur != pPVar4)) {
      (queue->mempool).super___shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (pPVar4->pool).super___shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(queue->mempool).super___shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 &(pPVar4->pool).super___shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    uVar7 = 0;
    do {
      pPVar4 = (buffer->super__Deque_base<ixy::Packet,_std::allocator<ixy::Packet>_>)._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      if ((buffer->super__Deque_base<ixy::Packet,_std::allocator<ixy::Packet>_>)._M_impl.
          super__Deque_impl_data._M_finish._M_cur == pPVar4) break;
      uVar13 = *(int *)&queue->num_entries - 1U & uVar10 + 1;
      uVar12 = (uint16_t)uVar13;
      if (uVar1 != uVar12) {
        piVar5 = queue->descriptors;
        lVar8 = (ulong)queue->tx_index * 0x10;
        piVar5[queue->tx_index].read.buffer_addr = pPVar4->addr_phys;
        *(uint *)((long)piVar5 + lVar8 + 8) = (uint)pPVar4->len | 0x2b300000;
        *(int *)((long)piVar5 + lVar8 + 0xc) = (int)pPVar4->len << 0xe;
        puVar6 = (queue->bufs_in_use).
                 super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur;
        if (puVar6 == (queue->bufs_in_use).
                      super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<unsigned_long,std::allocator<unsigned_long>>::
          _M_push_back_aux<unsigned_long_const&>
                    ((deque<unsigned_long,std::allocator<unsigned_long>> *)&queue->bufs_in_use,
                     &pPVar4->pool_entry);
        }
        else {
          *puVar6 = pPVar4->pool_entry;
          (queue->bufs_in_use).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur = puVar6 + 1;
        }
        this_00 = (pPVar4->pool).super___shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        (pPVar4->pool).super___shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (pPVar4->pool).super___shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        uVar2 = queue->num_entries;
        queue->tx_index = uVar2 - 1 & (short)*(undefined4 *)&queue->tx_index + 1U;
        std::deque<ixy::Packet,_std::allocator<ixy::Packet>_>::pop_front(buffer);
        uVar7 = uVar7 + 1;
        uVar10 = uVar13;
      }
    } while (uVar1 != uVar12);
    uVar9 = (ulong)(uint)((int)CONCAT62(in_register_00000032,queue_id) << 6) + 0x6018;
    if (uVar9 <= this->len - 4) {
      *(uint *)(this->addr + uVar9) = (uint)queue->tx_index;
      return uVar7;
    }
  }
  __assert_fail("reg <= len - 4",
                "/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
                ,0x1d2,"void ixy::IxgbeDevice::set_reg32(uint64_t, uint32_t)");
}

Assistant:

auto IxgbeDevice::tx_batch(uint16_t queue_id, std::deque<Packet> &buffer) -> uint32_t {
    auto sent_packets = 0;

    struct ixgbe_tx_queue *queue = &tx_queues.at(queue_id);

    clean_tx_queue(queue);

    auto cur_index = queue->tx_index;
    auto clean_index = queue->clean_index;

    if (!queue->mempool && !buffer.empty()) {
        queue->mempool = buffer.front().pool;
    }

    while (!buffer.empty()) {
        auto &p = buffer.front();

        auto next_index = wrap_ring(cur_index, queue->num_entries);

        if (clean_index == next_index) {
            // tx queue of device is full
            break;
        }

        volatile union ixgbe_adv_tx_desc *txd = queue->descriptors + queue->tx_index;
        // NIC reads from here
        txd->read.buffer_addr = p.get_phys_addr();
        // always the same flags: one buffer (EOP), advanced data descriptor, CRC offload, data length
        txd->read.cmd_type_len =
                static_cast<u32>(IXGBE_ADVTXD_DCMD_EOP | IXGBE_ADVTXD_DCMD_RS | IXGBE_ADVTXD_DCMD_IFCS |
                                 IXGBE_ADVTXD_DCMD_DEXT |
                                 IXGBE_ADVTXD_DTYP_DATA | p.size());
        // no fancy offloading stuff - only the total payload length
        // implement offloading flags here:
        // 	* ip checksum offloading is trivial: just set the offset
        // 	* tcp/udp checksum offloading is more annoying, you have to precalculate the pseudo-header checksum
        txd->read.olinfo_status = static_cast<u32>(p.size() << IXGBE_ADVTXD_PAYLEN_SHIFT);

        queue->bufs_in_use.push_back(p.pool_entry);

        p.pool.reset();

        queue->tx_index = wrap_ring(queue->tx_index, queue->num_entries);

        buffer.pop_front();

        cur_index = next_index;
        sent_packets += 1;
    }

    set_reg32(IXGBE_TDT(queue_id), queue->tx_index);

    return sent_packets;
}